

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcp_echo_server.cpp
# Opt level: O2

void __thiscall EchoServer::start(EchoServer *this)

{
  self *this_00;
  LogStream *this_01;
  SourceFile file;
  Logger local_ff8;
  undefined1 local_28 [12];
  
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_28,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/kcp_echo/kcp_echo_server.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_28._0_8_;
    file.m_size = local_28._8_4_;
    sznet::Logger::Logger(&local_ff8,file,0x37);
    this_00 = sznet::LogStream::operator<<(&local_ff8.m_impl.m_stream,"starting ");
    this_01 = sznet::LogStream::operator<<(this_00,numThreads);
    sznet::LogStream::operator<<(this_01," threads.");
    sznet::Logger::~Logger(&local_ff8);
  }
  sznet::net::KcpWithTcpServer::start(&this->m_server);
  return;
}

Assistant:

void start()
    {
        LOG_INFO << "starting " << numThreads << " threads.";
        m_server.start();
    }